

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O0

void __thiscall PolyFit<double>::solveRLS(PolyFit<double> *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  Index IVar4;
  double *pdVar5;
  vector<int,_std::allocator<int>_> *in_RDI;
  double __x;
  double extraout_XMM0_Qa;
  double dVar6;
  double extraout_XMM0_Qa_00;
  undefined1 auVar7 [16];
  PolyFit<double> *unaff_retaddr;
  double pNoOutliers;
  double fracInliers;
  int nInliers;
  vector<int,_std::allocator<int>_> inliers;
  double mse;
  set<int,_std::less<int>,_std::allocator<int>_> indexSet;
  int N;
  int trialCount;
  double p;
  Matrix<double,__1,_1,_0,__1,_1> bestCoef;
  vector<int,_std::allocator<int>_> bestSubset;
  PolyFit<double> *in_stack_00000370;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffed8;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  PolyFit<double> *this_00;
  int local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  int local_a4;
  vector<int,_std::allocator<int>_> local_a0;
  set<int,_std::less<int>,_std::allocator<int>_> *__x_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  uint local_50;
  uint local_4c;
  vector<int,_std::allocator<int>_> *inliers_00;
  
  inliers_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x247089);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffef0);
  dVar6 = 0.99;
  local_4c = 0;
  local_50 = 1;
  do {
    if ((int)local_50 <= (int)local_4c) break;
    logging::log(&logger,dVar6);
    this_00 = (PolyFit<double> *)&stack0xffffffffffffff80;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x24710e);
    std::vector<double,_std::allocator<double>_>::size
              ((vector<double,_std::allocator<double>_> *)
               in_RDI[0x69].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    randsample(this_00,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (int)in_stack_ffffffffffffff18,
               (set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x24714b);
    if ((int)sVar1 !=
        in_RDI[0x6c].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[3]) {
      __assert_fail("static_cast<int>(indexSet.size()) == options.maxMPts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rkwitt[P]polyran/src/polyfit.h"
                    ,0x118,"void PolyFit<double>::solveRLS() [T = double]");
    }
    dataToEigenSubset(this_00,in_stack_ffffffffffffff18);
    buildV((PolyFit<double> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff18 =
         (set<int,_std::less<int>,_std::allocator<int>_> *)solveLS(in_stack_00000370);
    __x_00 = in_stack_ffffffffffffff18;
    logging::log(&logger,(double)in_stack_ffffffffffffff18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x24724c);
    in_stack_ffffffffffffff14 = getInliers(unaff_retaddr,inliers_00);
    local_a4 = in_stack_ffffffffffffff14;
    logging::log(&logger,__x);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_a0);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0);
    dVar6 = extraout_XMM0_Qa;
    if (sVar3 < sVar2) {
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffff80,(vector<int,_std::allocator<int>_> *)__x_00);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_a0);
      auVar7._8_4_ = (int)(sVar2 >> 0x20);
      auVar7._0_8_ = sVar2;
      auVar7._12_4_ = 0x45300000;
      in_stack_fffffffffffffef0 =
           (vector<int,_std::allocator<int>_> *)
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x247342);
      local_b0 = (double)in_stack_fffffffffffffef0 / (double)IVar4;
      local_b8 = pow(local_b0,(double)in_RDI[0x6c].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[3]);
      local_b8 = 1.0 - local_b8;
      local_c0 = 1e-09;
      pdVar5 = std::max<double>(&local_c0,&local_b8);
      local_b8 = *pdVar5;
      local_c8 = 0.999999999;
      pdVar5 = std::min<double>(&local_c8,&local_b8);
      local_b8 = *pdVar5;
      in_stack_fffffffffffffee0 = (Matrix<double,__1,_1,_0,__1,_1> *)log(0.010000000000000009);
      dVar6 = log(local_b8);
      local_50 = (uint)((double)in_stack_fffffffffffffee0 / dVar6);
      dVar6 = logging::log(&logger,local_b0);
    }
    local_4c = local_4c + 1;
    if (in_RDI[0x6c].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[2] < (int)local_4c) {
      logging::log(&logger,dVar6);
      local_cc = 3;
    }
    else {
      local_cc = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x24751a);
    dVar6 = extraout_XMM0_Qa_00;
  } while (local_cc == 0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x247562);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void solveRLS(void)
    {
      std::vector<int> bestSubset;
      Eigen::Matrix<T, Eigen::Dynamic, 1> bestCoef;
      
      // Probability that we can at least choose
      // one sample with options.maxMPts free of
      // outliers (sugg. by Peter Kovesi's code)
      double p = 0.99;

      int trialCount = 0; int N = 1;
      while (N > trialCount)
      {
        logger.log(DEBUG, "[%s]: Trial %d\n",
            __func__, trialCount);

        std::set<int> indexSet;
        randsample(static_cast<int>(y.size()-1),
            options.maxMPts, indexSet);

        assert(static_cast<int>(indexSet.size()) == options.maxMPts);

        // Build (sample,signal) for current subset
        dataToEigenSubset(indexSet);
        buildV();
        
        // Solve the LS-fitting problem
        double mse = solveLS();
         logger.log(DEBUG, "[%s]: MSE=%.8f in %d-th RLS trial\n",
            __func__, mse, trialCount);

        // Compute inlier indices
        std::vector<int> inliers;
        int nInliers = getInliers(inliers);    

        logger.log(DEBUG, "[%s]: #Inliers = %d\n",
            __func__, nInliers);

        if (inliers.size() > bestSubset.size())
        {
          // Store settings
          bestSubset = inliers;
          bestCoef = pCoef;

          // Refine estimate of N (based on Peter Kovesi's MATLAB impl. of RANSAC)
          double fracInliers = static_cast<double>(inliers.size())/double(yM.rows());
          double pNoOutliers = 1 - pow(fracInliers,options.maxMPts);
          pNoOutliers = std::max(1e-9, pNoOutliers);  
          pNoOutliers = std::min(1-1e-9, pNoOutliers);
          N = log(1-p)/log(pNoOutliers);

          logger.log(DEBUG, "[%s]: Inlier fraction=%.2f, P(Choose no outlier)=%.2f --> N=%d\n",
              __func__, fracInliers, pNoOutliers, N);
        }

        ++trialCount;
        if (trialCount > options.maxTrial)
        {
          logger.log(WARNING, "[%s]: Maximum nr. of trials (%d) reached!\n",
              __func__, options.maxTrial);
          break;
        }
      }
      pCoef = bestCoef;
    }